

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

void __thiscall cxxopts::Option::Option(Option *this,Option *param_1)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->opts_)._M_dataplus._M_p = (pointer)&(this->opts_).field_2;
  pcVar1 = (param_1->opts_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->opts_)._M_string_length);
  (this->desc_)._M_dataplus._M_p = (pointer)&(this->desc_).field_2;
  pcVar1 = (param_1->desc_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->desc_,pcVar1,pcVar1 + (param_1->desc_)._M_string_length);
  (this->value_).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_1->value_).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  p_Var2 = (param_1->value_).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->value_).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->arg_help_)._M_dataplus._M_p = (pointer)&(this->arg_help_).field_2;
  pcVar1 = (param_1->arg_help_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->arg_help_,pcVar1,pcVar1 + (param_1->arg_help_)._M_string_length);
  return;
}

Assistant:

Option
    (
      std::string opts,
      std::string desc,
      std::shared_ptr<const Value>  value = ::cxxopts::value<bool>(),
      std::string arg_help = ""
    )
    : opts_(std::move(opts))
    , desc_(std::move(desc))
    , value_(std::move(value))
    , arg_help_(std::move(arg_help))
    {
    }